

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

ParsedInternalKey * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_(ParsedInternalKey *this)

{
  long in_RSI;
  Slice local_c0 [2];
  Slice local_a0;
  leveldb local_90 [54];
  allocator local_5a;
  undefined1 local_59;
  char local_58 [8];
  char buf [50];
  ParsedInternalKey *this_local;
  string *result;
  
  snprintf(local_58,0x32,"\' @ %llu : %d",*(undefined8 *)(in_RSI + 0x10),
           (ulong)*(uint *)(in_RSI + 0x18));
  local_59 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"\'",&local_5a);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  Slice::ToString_abi_cxx11_(local_c0);
  Slice::Slice(&local_a0,(string *)local_c0);
  EscapeString_abi_cxx11_(local_90,&local_a0);
  std::__cxx11::string::operator+=((string *)this,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::operator+=((string *)this,local_58);
  return this;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
        char buf[50];
        snprintf(buf, sizeof(buf), "' @ %llu : %d",
                 (unsigned long long) sequence,
                 int(type));
        std::string result = "'";
        result += EscapeString(user_key.ToString());
        result += buf;
        return result;
    }